

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

String * __thiscall flexbuffers::Reference::AsString(String *__return_storage_ptr__,Reference *this)

{
  uint8_t byte_width;
  uint8_t *puVar1;
  size_t sz;
  uint8_t *key;
  Reference *this_local;
  
  if (this->type_ == FBT_STRING) {
    puVar1 = Indirect(this);
    String::String(__return_storage_ptr__,puVar1,this->byte_width_);
  }
  else if (this->type_ == FBT_KEY) {
    puVar1 = Indirect(this);
    byte_width = this->byte_width_;
    sz = strlen((char *)puVar1);
    String::String(__return_storage_ptr__,puVar1,byte_width,sz);
  }
  else {
    String::EmptyString();
  }
  return __return_storage_ptr__;
}

Assistant:

String AsString() const {
    if (type_ == FBT_STRING) {
      return String(Indirect(), byte_width_);
    } else if (type_ == FBT_KEY) {
      auto key = Indirect();
      return String(key, byte_width_,
                    strlen(reinterpret_cast<const char *>(key)));
    } else {
      return String::EmptyString();
    }
  }